

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

int Ivy_FastMapNodeDelay(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  lVar1 = *(long *)((long)pAig->pData + 0x10);
  lVar4 = (long)*(int *)((long)pAig->pData + 8);
  lVar3 = pObj->Id * lVar4;
  lVar5 = (long)*(char *)(lVar1 + lVar3);
  if (lVar5 < 1) {
    iVar2 = 1;
  }
  else {
    lVar6 = 0;
    iVar2 = 0;
    do {
      iVar7 = *(int *)(lVar3 + lVar1 + 0xc + lVar6 * 4);
      if (((long)iVar7 < 0) || (pAig->vObjs->nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar7 = (int)*(short *)(lVar1 + 8 + *pAig->vObjs->pArray[iVar7] * lVar4);
      if (iVar2 <= iVar7) {
        iVar2 = iVar7;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int Ivy_FastMapNodeDelay( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    Ivy_Supp_t * pSupp, * pSuppF;
    int c, Delay = 0;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    for ( c = 0; c < pSupp->nSize; c++ )
    {
        pSuppF = Ivy_ObjSupp( pAig, Ivy_ManObj(pAig, pSupp->pArray[c]) );
        Delay = IVY_MAX( Delay, pSuppF->Delay );
    }
    return 1 + Delay;
}